

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_psbt.cpp
# Opt level: O0

void __thiscall cfdcapi_psbt_GetPsbtOutput_Test::TestBody(cfdcapi_psbt_GetPsbtOutput_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  char *pcVar3;
  char *pcVar4;
  char *in_R9;
  AssertionResult gtest_ar_38;
  AssertionResult gtest_ar_37;
  AssertionResult gtest_ar_36;
  AssertionResult gtest_ar_35;
  AssertionResult gtest_ar_34;
  AssertionResult gtest_ar_33;
  AssertionResult gtest_ar_32;
  AssertionResult gtest_ar_31;
  char *exp_unknown_value;
  char *unknown_key;
  AssertionResult gtest_ar_30;
  AssertionResult gtest_ar_29;
  AssertionResult gtest_ar_28;
  char *value;
  AssertionResult gtest_ar_27;
  AssertionResult gtest_ar_26;
  AssertionResult gtest_ar_25;
  AssertionResult gtest_ar_24;
  AssertionResult gtest_ar_23;
  AssertionResult gtest_ar_22;
  AssertionResult gtest_ar_21;
  AssertionResult gtest_ar_20;
  AssertionResult gtest_ar_19;
  AssertionResult gtest_ar_18;
  AssertionResult gtest_ar_17;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  uint32_t index;
  char *pk;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  uint32_t list_num;
  void *pubkey_list_handle;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  char *path;
  char *fingerprint;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  char *signature;
  AssertionResult gtest_ar_2;
  char *pubkey;
  AssertionResult gtest_ar_1;
  char *psbt_base64;
  void *psbt_handle;
  int net_type;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  bool *in_stack_fffffffffffff5a8;
  AssertionResult *in_stack_fffffffffffff5b0;
  CfdErrorCode *in_stack_fffffffffffff5b8;
  char *in_stack_fffffffffffff5c0;
  AssertionResult *pAVar5;
  undefined7 in_stack_fffffffffffff5c8;
  undefined1 in_stack_fffffffffffff5cf;
  void *in_stack_fffffffffffff5e8;
  undefined8 in_stack_fffffffffffff5f0;
  char *in_stack_fffffffffffff660;
  void *in_stack_fffffffffffff668;
  AssertionResult *this_00;
  AssertionResult *in_stack_fffffffffffff770;
  uint32_t in_stack_fffffffffffff778;
  int in_stack_fffffffffffff77c;
  char *in_stack_fffffffffffff780;
  AssertionResult *in_stack_fffffffffffff788;
  undefined7 in_stack_fffffffffffff808;
  undefined1 in_stack_fffffffffffff80f;
  char *in_stack_fffffffffffff810;
  AssertionResult *in_stack_fffffffffffff818;
  undefined7 in_stack_fffffffffffff820;
  undefined1 in_stack_fffffffffffff827;
  char *in_stack_fffffffffffff828;
  undefined7 in_stack_fffffffffffff850;
  char *in_stack_fffffffffffff858;
  AssertionResult *in_stack_fffffffffffff860;
  undefined7 in_stack_fffffffffffff868;
  undefined1 in_stack_fffffffffffff86f;
  undefined7 in_stack_fffffffffffff898;
  undefined1 in_stack_fffffffffffff89f;
  uint32_t *in_stack_fffffffffffff8a0;
  AssertionResult *in_stack_fffffffffffff8a8;
  undefined7 in_stack_fffffffffffff8b0;
  undefined1 in_stack_fffffffffffff8b7;
  char *in_stack_fffffffffffff8b8;
  AssertHelper local_690;
  Message local_688;
  undefined4 local_67c;
  AssertionResult local_678;
  AssertHelper local_668;
  Message local_660;
  undefined4 local_654;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff9b8;
  AssertHelper in_stack_fffffffffffff9c0;
  uint32_t in_stack_fffffffffffff9cc;
  undefined4 in_stack_fffffffffffff9d0;
  undefined4 in_stack_fffffffffffff9d4;
  void *in_stack_fffffffffffff9d8;
  AssertHelper local_618;
  Message local_610;
  AssertionResult local_608;
  AssertHelper local_5f8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffa10;
  uint32_t in_stack_fffffffffffffa18;
  int in_stack_fffffffffffffa1c;
  char **in_stack_fffffffffffffa20;
  undefined4 in_stack_fffffffffffffa28;
  uint32_t in_stack_fffffffffffffa2c;
  AssertHelper in_stack_fffffffffffffa30;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffa38;
  AssertionResult local_5b8;
  AssertHelper local_5a8;
  Message local_5a0;
  undefined4 local_594;
  AssertionResult local_590;
  AssertHelper local_580;
  Message local_578;
  undefined4 local_56c;
  uint32_t in_stack_fffffffffffffa98;
  uint32_t in_stack_fffffffffffffa9c;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffaa0;
  char *in_stack_fffffffffffffaa8;
  undefined8 in_stack_fffffffffffffab0;
  int net_type_00;
  AssertHelper in_stack_fffffffffffffab8;
  Message local_540;
  undefined4 local_534;
  void **in_stack_fffffffffffffad0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffad8;
  AssertHelper in_stack_fffffffffffffae0;
  uint32_t in_stack_fffffffffffffae8;
  int in_stack_fffffffffffffaec;
  void *in_stack_fffffffffffffaf0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffaf8;
  AssertHelper local_500;
  Message local_4f8;
  undefined4 local_4ec;
  AssertionResult local_4e8;
  char *local_4d8;
  AssertHelper local_4d0;
  Message local_4c8;
  undefined4 local_4bc;
  AssertionResult local_4b8;
  AssertHelper local_4a8;
  Message local_4a0;
  undefined4 local_494;
  AssertionResult local_490;
  AssertHelper local_480;
  Message local_478;
  undefined4 local_46c;
  AssertionResult local_468;
  AssertHelper local_458;
  Message local_450;
  undefined4 local_444;
  AssertionResult local_440;
  AssertHelper local_430;
  Message local_428;
  AssertionResult local_420;
  AssertHelper local_410;
  Message local_408;
  AssertionResult local_400;
  AssertHelper local_3f0;
  Message local_3e8;
  AssertionResult local_3e0;
  AssertHelper local_3d0;
  Message local_3c8;
  AssertionResult local_3c0;
  AssertHelper local_3b0;
  Message local_3a8 [2];
  char **in_stack_fffffffffffffc68;
  AssertHelper in_stack_fffffffffffffc70;
  uint32_t in_stack_fffffffffffffc78;
  int in_stack_fffffffffffffc7c;
  void *in_stack_fffffffffffffc80;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffc88;
  AssertHelper local_370;
  Message local_368;
  undefined4 in_stack_fffffffffffffca0;
  undefined4 in_stack_fffffffffffffca4;
  AssertionResult local_358;
  AssertHelper local_348;
  Message local_340;
  undefined4 local_334;
  AssertionResult local_330;
  AssertHelper local_320;
  Message local_318;
  AssertionResult local_310;
  AssertHelper local_300;
  Message local_2f8;
  AssertionResult local_2f0;
  AssertHelper local_2e0;
  Message local_2d8;
  undefined4 local_2cc;
  AssertionResult local_2c8;
  uint local_2b4;
  char *local_2b0;
  AssertHelper local_2a8;
  Message local_2a0;
  undefined4 local_294;
  AssertionResult local_290;
  AssertHelper local_280;
  Message local_278;
  undefined4 local_26c;
  AssertionResult local_268;
  uint local_254;
  undefined8 local_250;
  AssertHelper local_248;
  Message local_240;
  undefined4 local_234;
  AssertionResult local_230;
  AssertHelper local_220;
  Message local_218;
  undefined4 local_20c;
  AssertionResult local_208;
  AssertHelper local_1f8;
  Message local_1f0;
  AssertionResult local_1e8;
  AssertHelper local_1d8;
  Message local_1d0;
  AssertionResult local_1c8;
  AssertHelper local_1b8;
  Message local_1b0;
  undefined4 local_1a4;
  AssertionResult local_1a0;
  char *local_190;
  char *local_188;
  AssertHelper local_180;
  Message local_178;
  undefined4 local_16c;
  AssertionResult local_168;
  AssertHelper local_158;
  Message local_150;
  AssertionResult local_148;
  AssertHelper local_138;
  Message local_130;
  undefined4 local_124;
  AssertionResult local_120;
  char *local_110;
  AssertHelper local_108;
  Message local_100;
  undefined4 local_f4;
  AssertionResult local_f0;
  char *local_e0;
  AssertHelper local_d8;
  Message local_d0;
  undefined4 local_c4;
  AssertionResult local_c0;
  char *local_b0;
  undefined8 local_a8;
  undefined4 local_9c;
  string local_98;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_61;
  AssertionResult local_60;
  AssertHelper local_50;
  Message local_48 [3];
  undefined4 local_2c;
  AssertionResult local_28;
  int local_14;
  long local_10;
  
  net_type_00 = (int)((ulong)in_stack_fffffffffffffab0 >> 0x20);
  local_10 = 0;
  local_14 = CfdCreateHandle((void **)CONCAT17(in_stack_fffffffffffff5cf,in_stack_fffffffffffff5c8))
  ;
  local_2c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT17(in_stack_fffffffffffff5cf,in_stack_fffffffffffff5c8),
             in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8,(int *)in_stack_fffffffffffff5b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message(local_48);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3997ea);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
               ,0x4ae,pcVar3);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message((Message *)0x39984d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3998a2);
  local_61 = local_10 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8,(type *)0x3998d6);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&local_60,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
               ,0x4af,pcVar3);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    testing::Message::~Message((Message *)0x3999d2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x399a4d);
  local_9c = 1;
  local_a8 = 0;
  local_b0 = 
  "cHNidP8BAF4CAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////ARBLzR0AAAAAIgAgPK0GGd5n5iR6dqECgTY1wFNFfGuk/eSsH/2BSNcOS8wAAAAAAAEBIAhYzR0AAAAAF6kUlF+1A5GnBjfB/8Wrf7ZTCMLyMXWHIgIDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/NHMEQCICBjWTfgUXDYPcMhOts6bq5mcTAI5KvDi0kSxWgN7E8MAiAzwIpxowdXsIRj1TDsBY7XQBlo+zC+9j1FSXIaDkhbhAEiAgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7R0cwRAIgXSdKeIfePvrehKSjScTDb1ibVWI7ECe32m2sicF4VjQCIGoDr+u7tgifHjf6yPmZpAFRYciSAUT9UxEtoFgEzUPMAQEDBAEAAAABBCIAIJxNrLJeu4rai7sa3bhp3qTYFwzJUfHZaUshVOFYMnbJAQVHUiEDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/MhA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHUq4iBgOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8xgqcEdgLAAAgAAAAIAAAACAAAAAAAsAAAAiBgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7Rxida22GLAAAgAAAAIAAAACAAAAAAAsAAAAAAQAiACA8rQYZ3mfmJHp2oQKBNjXAU0V8a6T95Kwf/YFI1w5LzAEBR1IhApBtOZ9tu+zImNS43j9JdHTIakHyzzbXH5XlygawdIZ7IQJiLHl07DLeda+jczsJpsM9DepRSyn6rM+wmRd09GIiQlKuIgICYix5dOwy3nWvo3M7CabDPQ3qUUsp+qzPsJkXdPRiIkIYnWtthiwAAIAAAACAAAAAgAAAAAAMAAAAIgICkG05n2277MiY1LjeP0l0dMhqQfLPNtcfleXKBrB0hnsYKnBHYCwAAIAAAACAAAAAgAAAAAAMAAAAAA=="
  ;
  local_14 = CfdCreatePsbtHandle(in_stack_fffffffffffffab8.data_,net_type_00,
                                 in_stack_fffffffffffffaa8,(char *)in_stack_fffffffffffffaa0.ptr_,
                                 in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98,
                                 in_stack_fffffffffffffad0);
  local_c4 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT17(in_stack_fffffffffffff5cf,in_stack_fffffffffffff5c8),
             in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8,(int *)in_stack_fffffffffffff5b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x399b5e);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
               ,0x4b6,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    testing::Message::~Message((Message *)0x399bc1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x399c19);
  if (local_14 == 0) {
    local_e0 = "02622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f4622242";
    local_14 = CfdIsFindPsbtPubkeyRecord
                         ((void *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28),
                          in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c,
                          in_stack_fffffffffffffa18,(char *)in_stack_fffffffffffffa10.ptr_);
    local_f4 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT17(in_stack_fffffffffffff5cf,in_stack_fffffffffffff5c8),
               in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8,(int *)in_stack_fffffffffffff5b0)
    ;
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f0);
    if (!bVar1) {
      testing::Message::Message(&local_100);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x399d0e);
      testing::internal::AssertHelper::AssertHelper
                (&local_108,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x4ba,pcVar3);
      testing::internal::AssertHelper::operator=(&local_108,&local_100);
      testing::internal::AssertHelper::~AssertHelper(&local_108);
      testing::Message::~Message((Message *)0x399d71);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x399dc9);
    local_110 = (char *)0x0;
    local_14 = CfdGetPsbtPubkeyRecord
                         (in_stack_fffffffffffffaf8.ptr_,in_stack_fffffffffffffaf0,
                          in_stack_fffffffffffffaec,in_stack_fffffffffffffae8,
                          (char *)in_stack_fffffffffffffae0.data_,
                          (char **)in_stack_fffffffffffffad8.ptr_);
    local_124 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT17(in_stack_fffffffffffff5cf,in_stack_fffffffffffff5c8),
               in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8,(int *)in_stack_fffffffffffff5b0)
    ;
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_120);
    if (!bVar1) {
      testing::Message::Message(&local_130);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x399eb5);
      testing::internal::AssertHelper::AssertHelper
                (&local_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x4bf,pcVar3);
      testing::internal::AssertHelper::operator=(&local_138,&local_130);
      testing::internal::AssertHelper::~AssertHelper(&local_138);
      testing::Message::~Message((Message *)0x399f18);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x399f6d);
    if (local_14 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_148,"\"9d6b6d862c0000800000008000000080000000000c000000\"",
                 "signature","9d6b6d862c0000800000008000000080000000000c000000",local_110);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_148);
      if (!bVar1) {
        testing::Message::Message(&local_150);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x39a01c);
        testing::internal::AssertHelper::AssertHelper
                  (&local_158,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x4c1,pcVar3);
        testing::internal::AssertHelper::operator=(&local_158,&local_150);
        testing::internal::AssertHelper::~AssertHelper(&local_158);
        testing::Message::~Message((Message *)0x39a07f);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x39a0d7);
      local_14 = CfdFreeStringBuffer((char *)in_stack_fffffffffffff5b8);
      local_16c = 0;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)CONCAT17(in_stack_fffffffffffff5cf,in_stack_fffffffffffff5c8),
                 in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8,
                 (int *)in_stack_fffffffffffff5b0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_168);
      if (!bVar1) {
        testing::Message::Message(&local_178);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x39a198);
        testing::internal::AssertHelper::AssertHelper
                  (&local_180,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x4c3,pcVar3);
        testing::internal::AssertHelper::operator=(&local_180,&local_178);
        testing::internal::AssertHelper::~AssertHelper(&local_180);
        testing::Message::~Message((Message *)0x39a1fb);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x39a250);
    }
    local_188 = (char *)0x0;
    local_190 = (char *)0x0;
    local_14 = CfdGetPsbtBip32Data(in_stack_fffffffffffffc88.ptr_,in_stack_fffffffffffffc80,
                                   in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78,
                                   (char *)in_stack_fffffffffffffc70.data_,in_stack_fffffffffffffc68
                                   ,(char **)CONCAT44(in_stack_fffffffffffffca4,
                                                      in_stack_fffffffffffffca0));
    local_1a4 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT17(in_stack_fffffffffffff5cf,in_stack_fffffffffffff5c8),
               in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8,(int *)in_stack_fffffffffffff5b0)
    ;
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1a0);
    if (!bVar1) {
      testing::Message::Message(&local_1b0);
      in_stack_fffffffffffff8b8 =
           testing::AssertionResult::failure_message((AssertionResult *)0x39a358);
      testing::internal::AssertHelper::AssertHelper
                (&local_1b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x4c9,in_stack_fffffffffffff8b8);
      testing::internal::AssertHelper::operator=(&local_1b8,&local_1b0);
      testing::internal::AssertHelper::~AssertHelper(&local_1b8);
      testing::Message::~Message((Message *)0x39a3bb);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x39a410);
    if (local_14 == 0) {
      in_stack_fffffffffffff8a8 = &local_1c8;
      testing::internal::CmpHelperSTREQ
                ((internal *)in_stack_fffffffffffff8a8,"\"9d6b6d86\"","fingerprint","9d6b6d86",
                 local_188);
      in_stack_fffffffffffff8b7 =
           testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffff8a8);
      if (!(bool)in_stack_fffffffffffff8b7) {
        testing::Message::Message(&local_1d0);
        in_stack_fffffffffffff8a0 =
             (uint32_t *)testing::AssertionResult::failure_message((AssertionResult *)0x39a4bf);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1d8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x4cb,(char *)in_stack_fffffffffffff8a0);
        testing::internal::AssertHelper::operator=(&local_1d8,&local_1d0);
        testing::internal::AssertHelper::~AssertHelper(&local_1d8);
        testing::Message::~Message((Message *)0x39a522);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x39a577);
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_1e8,"\"44\'/0\'/0\'/0/12\"","path","44\'/0\'/0\'/0/12",local_190
                );
      in_stack_fffffffffffff89f = testing::AssertionResult::operator_cast_to_bool(&local_1e8);
      if (!(bool)in_stack_fffffffffffff89f) {
        testing::Message::Message(&local_1f0);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x39a618);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1f8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x4cc,pcVar3);
        testing::internal::AssertHelper::operator=(&local_1f8,&local_1f0);
        testing::internal::AssertHelper::~AssertHelper(&local_1f8);
        testing::Message::~Message((Message *)0x39a67b);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x39a6d3);
      local_14 = CfdFreeStringBuffer((char *)in_stack_fffffffffffff5b8);
      local_20c = 0;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)CONCAT17(in_stack_fffffffffffff5cf,in_stack_fffffffffffff5c8),
                 in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8,
                 (int *)in_stack_fffffffffffff5b0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_208);
      if (!bVar1) {
        testing::Message::Message(&local_218);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x39a794);
        testing::internal::AssertHelper::AssertHelper
                  (&local_220,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x4ce,pcVar3);
        testing::internal::AssertHelper::operator=(&local_220,&local_218);
        testing::internal::AssertHelper::~AssertHelper(&local_220);
        testing::Message::~Message((Message *)0x39a7f7);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x39a84f);
      local_14 = CfdFreeStringBuffer((char *)in_stack_fffffffffffff5b8);
      local_234 = 0;
      in_stack_fffffffffffff860 = &local_230;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)CONCAT17(in_stack_fffffffffffff5cf,in_stack_fffffffffffff5c8),
                 in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8,
                 (int *)in_stack_fffffffffffff5b0);
      in_stack_fffffffffffff86f =
           testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffff860);
      if (!(bool)in_stack_fffffffffffff86f) {
        testing::Message::Message(&local_240);
        in_stack_fffffffffffff858 =
             testing::AssertionResult::failure_message((AssertionResult *)0x39a910);
        testing::internal::AssertHelper::AssertHelper
                  (&local_248,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x4d0,in_stack_fffffffffffff858);
        testing::internal::AssertHelper::operator=(&local_248,&local_240);
        testing::internal::AssertHelper::~AssertHelper(&local_248);
        testing::Message::~Message((Message *)0x39a973);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x39a9c8);
    }
    local_250 = 0;
    local_254 = 0;
    local_14 = CfdGetPsbtPubkeyList
                         (in_stack_fffffffffffff8b8,
                          (void *)CONCAT17(in_stack_fffffffffffff8b7,in_stack_fffffffffffff8b0),
                          (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20),
                          (uint32_t)in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0,
                          (void **)CONCAT17(in_stack_fffffffffffff89f,in_stack_fffffffffffff898));
    local_26c = 0;
    pAVar5 = &local_268;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT17(in_stack_fffffffffffff5cf,in_stack_fffffffffffff5c8),
               in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8,(int *)in_stack_fffffffffffff5b0)
    ;
    uVar2 = testing::AssertionResult::operator_cast_to_bool(pAVar5);
    if (!(bool)uVar2) {
      testing::Message::Message(&local_278);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x39aac1);
      testing::internal::AssertHelper::AssertHelper
                (&local_280,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x4d6,pcVar3);
      testing::internal::AssertHelper::operator=(&local_280,&local_278);
      testing::internal::AssertHelper::~AssertHelper(&local_280);
      testing::Message::~Message((Message *)0x39ab24);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x39ab79);
    local_294 = 2;
    testing::internal::EqHelper<false>::Compare<int,unsigned_int>
              ((char *)CONCAT17(in_stack_fffffffffffff5cf,in_stack_fffffffffffff5c8),
               in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8,(uint *)in_stack_fffffffffffff5b0
              );
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_290);
    if (!bVar1) {
      testing::Message::Message(&local_2a0);
      in_stack_fffffffffffff828 =
           testing::AssertionResult::failure_message((AssertionResult *)0x39ac26);
      testing::internal::AssertHelper::AssertHelper
                (&local_2a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x4d7,in_stack_fffffffffffff828);
      testing::internal::AssertHelper::operator=(&local_2a8,&local_2a0);
      testing::internal::AssertHelper::~AssertHelper(&local_2a8);
      testing::Message::~Message((Message *)0x39ac89);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x39ace1);
    if (local_14 == 0) {
      local_2b0 = (char *)0x0;
      local_188 = (char *)0x0;
      local_190 = (char *)0x0;
      for (local_2b4 = 0; local_2b4 < local_254; local_2b4 = local_2b4 + 1) {
        local_14 = CfdGetPsbtPubkeyListData
                             (in_stack_fffffffffffff9d8,
                              (void *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
                              in_stack_fffffffffffff9cc,(char **)in_stack_fffffffffffff9c0.data_,
                              (char **)in_stack_fffffffffffff9b8.ptr_);
        local_2cc = 0;
        in_stack_fffffffffffff818 = &local_2c8;
        testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                  ((char *)CONCAT17(in_stack_fffffffffffff5cf,in_stack_fffffffffffff5c8),
                   in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8,
                   (int *)in_stack_fffffffffffff5b0);
        in_stack_fffffffffffff827 =
             testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffff818);
        if (!(bool)in_stack_fffffffffffff827) {
          testing::Message::Message(&local_2d8);
          in_stack_fffffffffffff810 =
               testing::AssertionResult::failure_message((AssertionResult *)0x39ae0f);
          testing::internal::AssertHelper::AssertHelper
                    (&local_2e0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                     ,0x4de,in_stack_fffffffffffff810);
          testing::internal::AssertHelper::operator=(&local_2e0,&local_2d8);
          testing::internal::AssertHelper::~AssertHelper(&local_2e0);
          testing::Message::~Message((Message *)0x39ae72);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x39aeca);
        if (local_14 == 0) {
          if (local_2b4 == 0) {
            testing::internal::CmpHelperSTREQ
                      ((internal *)&local_2f0,
                       "\"02622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f4622242\"","pk"
                       ,"02622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f4622242",
                       local_2b0);
            in_stack_fffffffffffff80f = testing::AssertionResult::operator_cast_to_bool(&local_2f0);
            if (!(bool)in_stack_fffffffffffff80f) {
              testing::Message::Message(&local_2f8);
              pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x39af87);
              testing::internal::AssertHelper::AssertHelper
                        (&local_300,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                         ,0x4e1,pcVar3);
              testing::internal::AssertHelper::operator=(&local_300,&local_2f8);
              testing::internal::AssertHelper::~AssertHelper(&local_300);
              testing::Message::~Message((Message *)0x39afea);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x39b03f);
          }
          else if (local_2b4 == 1) {
            testing::internal::CmpHelperSTREQ
                      ((internal *)&local_310,
                       "\"02906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b\"","pk"
                       ,"02906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b",
                       local_2b0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_310);
            if (!bVar1) {
              testing::Message::Message(&local_318);
              pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x39b0f3);
              testing::internal::AssertHelper::AssertHelper
                        (&local_320,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                         ,0x4e3,pcVar3);
              testing::internal::AssertHelper::operator=(&local_320,&local_318);
              testing::internal::AssertHelper::~AssertHelper(&local_320);
              testing::Message::~Message((Message *)0x39b156);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x39b1ab);
          }
          local_14 = CfdFreeStringBuffer((char *)in_stack_fffffffffffff5b8);
          local_334 = 0;
          testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                    ((char *)CONCAT17(in_stack_fffffffffffff5cf,in_stack_fffffffffffff5c8),
                     in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8,
                     (int *)in_stack_fffffffffffff5b0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_330);
          if (!bVar1) {
            testing::Message::Message(&local_340);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x39b270);
            testing::internal::AssertHelper::AssertHelper
                      (&local_348,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                       ,0x4e6,pcVar3);
            testing::internal::AssertHelper::operator=(&local_348,&local_340);
            testing::internal::AssertHelper::~AssertHelper(&local_348);
            testing::Message::~Message((Message *)0x39b2d3);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x39b328);
          local_2b0 = (char *)0x0;
        }
        local_14 = CfdGetPsbtPubkeyListBip32Data
                             (in_stack_fffffffffffffa38.ptr_,in_stack_fffffffffffffa30.data_,
                              in_stack_fffffffffffffa2c,in_stack_fffffffffffffa20,
                              (char **)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18)
                              ,(char **)in_stack_fffffffffffffa10.ptr_);
        testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                  ((char *)CONCAT17(in_stack_fffffffffffff5cf,in_stack_fffffffffffff5c8),
                   in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8,
                   (int *)in_stack_fffffffffffff5b0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_358);
        if (!bVar1) {
          testing::Message::Message(&local_368);
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x39b41e);
          testing::internal::AssertHelper::AssertHelper
                    (&local_370,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                     ,0x4ea,pcVar3);
          testing::internal::AssertHelper::operator=(&local_370,&local_368);
          testing::internal::AssertHelper::~AssertHelper(&local_370);
          testing::Message::~Message((Message *)0x39b481);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x39b4d9);
        CfdcapiPsbtDumpLog((int)((ulong)in_stack_fffffffffffff5f0 >> 0x20),in_stack_fffffffffffff5e8
                          );
        if (local_14 == 0) {
          if (local_2b4 == 0) {
            testing::internal::CmpHelperSTREQ
                      ((internal *)&stack0xfffffffffffffc80,
                       "\"02622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f4622242\"","pk"
                       ,"02622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f4622242",
                       local_2b0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool
                              ((AssertionResult *)&stack0xfffffffffffffc80);
            if (!bVar1) {
              testing::Message::Message((Message *)&stack0xfffffffffffffc78);
              pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x39b5aa);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&stack0xfffffffffffffc70,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                         ,0x4ee,pcVar3);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&stack0xfffffffffffffc70,
                         (Message *)&stack0xfffffffffffffc78);
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)&stack0xfffffffffffffc70);
              testing::Message::~Message((Message *)0x39b60d);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x39b662);
            in_stack_fffffffffffff788 = (AssertionResult *)(local_3a8 + 1);
            testing::internal::CmpHelperSTREQ
                      ((internal *)in_stack_fffffffffffff788,"\"9d6b6d86\"","fingerprint","9d6b6d86"
                       ,local_188);
            bVar1 = testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffff788);
            if (!bVar1) {
              testing::Message::Message(local_3a8);
              in_stack_fffffffffffff780 =
                   testing::AssertionResult::failure_message((AssertionResult *)0x39b703);
              testing::internal::AssertHelper::AssertHelper
                        (&local_3b0,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                         ,0x4ef,in_stack_fffffffffffff780);
              testing::internal::AssertHelper::operator=(&local_3b0,local_3a8);
              testing::internal::AssertHelper::~AssertHelper(&local_3b0);
              testing::Message::~Message((Message *)0x39b766);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x39b7bb);
            in_stack_fffffffffffff770 = &local_3c0;
            testing::internal::CmpHelperSTREQ
                      ((internal *)in_stack_fffffffffffff770,"\"44\'/0\'/0\'/0/12\"","path",
                       "44\'/0\'/0\'/0/12",local_190);
            bVar1 = testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffff770);
            in_stack_fffffffffffff77c = CONCAT13(bVar1,(int3)in_stack_fffffffffffff77c);
            if (!bVar1) {
              testing::Message::Message(&local_3c8);
              pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x39b85c);
              testing::internal::AssertHelper::AssertHelper
                        (&local_3d0,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                         ,0x4f0,pcVar3);
              testing::internal::AssertHelper::operator=(&local_3d0,&local_3c8);
              testing::internal::AssertHelper::~AssertHelper(&local_3d0);
              testing::Message::~Message((Message *)0x39b8bf);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x39b914);
          }
          else if (local_2b4 == 1) {
            testing::internal::CmpHelperSTREQ
                      ((internal *)&local_3e0,
                       "\"02906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b\"","pk"
                       ,"02906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b",
                       local_2b0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3e0);
            if (!bVar1) {
              testing::Message::Message(&local_3e8);
              pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x39b9c8);
              testing::internal::AssertHelper::AssertHelper
                        (&local_3f0,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                         ,0x4f2,pcVar3);
              testing::internal::AssertHelper::operator=(&local_3f0,&local_3e8);
              testing::internal::AssertHelper::~AssertHelper(&local_3f0);
              testing::Message::~Message((Message *)0x39ba2b);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x39ba80);
            testing::internal::CmpHelperSTREQ
                      ((internal *)&local_400,"\"2a704760\"","fingerprint","2a704760",local_188);
            bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_400);
            if (!bVar1) {
              testing::Message::Message(&local_408);
              pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x39bb21);
              testing::internal::AssertHelper::AssertHelper
                        (&local_410,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                         ,0x4f3,pcVar3);
              testing::internal::AssertHelper::operator=(&local_410,&local_408);
              testing::internal::AssertHelper::~AssertHelper(&local_410);
              testing::Message::~Message((Message *)0x39bb84);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x39bbd9);
            testing::internal::CmpHelperSTREQ
                      ((internal *)&local_420,"\"44\'/0\'/0\'/0/12\"","path","44\'/0\'/0\'/0/12",
                       local_190);
            bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_420);
            if (!bVar1) {
              testing::Message::Message(&local_428);
              pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x39bc7a);
              testing::internal::AssertHelper::AssertHelper
                        (&local_430,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                         ,0x4f4,pcVar3);
              testing::internal::AssertHelper::operator=(&local_430,&local_428);
              testing::internal::AssertHelper::~AssertHelper(&local_430);
              testing::Message::~Message((Message *)0x39bcdd);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x39bd32);
          }
          local_14 = CfdFreeStringBuffer((char *)in_stack_fffffffffffff5b8);
          local_444 = 0;
          testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                    ((char *)CONCAT17(in_stack_fffffffffffff5cf,in_stack_fffffffffffff5c8),
                     in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8,
                     (int *)in_stack_fffffffffffff5b0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_440);
          if (!bVar1) {
            testing::Message::Message(&local_450);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x39bdf7);
            testing::internal::AssertHelper::AssertHelper
                      (&local_458,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                       ,0x4f7,pcVar3);
            testing::internal::AssertHelper::operator=(&local_458,&local_450);
            testing::internal::AssertHelper::~AssertHelper(&local_458);
            testing::Message::~Message((Message *)0x39be5a);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x39beb2);
          local_2b0 = (char *)0x0;
          local_14 = CfdFreeStringBuffer((char *)in_stack_fffffffffffff5b8);
          local_46c = 0;
          testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                    ((char *)CONCAT17(in_stack_fffffffffffff5cf,in_stack_fffffffffffff5c8),
                     in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8,
                     (int *)in_stack_fffffffffffff5b0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_468);
          if (!bVar1) {
            testing::Message::Message(&local_478);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x39bf7f);
            testing::internal::AssertHelper::AssertHelper
                      (&local_480,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                       ,0x4fa,pcVar3);
            testing::internal::AssertHelper::operator=(&local_480,&local_478);
            testing::internal::AssertHelper::~AssertHelper(&local_480);
            testing::Message::~Message((Message *)0x39bfe2);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x39c03a);
          local_188 = (char *)0x0;
          local_14 = CfdFreeStringBuffer((char *)in_stack_fffffffffffff5b8);
          local_494 = 0;
          testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                    ((char *)CONCAT17(in_stack_fffffffffffff5cf,in_stack_fffffffffffff5c8),
                     in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8,
                     (int *)in_stack_fffffffffffff5b0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_490);
          if (!bVar1) {
            testing::Message::Message(&local_4a0);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x39c107);
            testing::internal::AssertHelper::AssertHelper
                      (&local_4a8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                       ,0x4fd,pcVar3);
            testing::internal::AssertHelper::operator=(&local_4a8,&local_4a0);
            testing::internal::AssertHelper::~AssertHelper(&local_4a8);
            testing::Message::~Message((Message *)0x39c16a);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x39c1bf);
          local_190 = (char *)0x0;
        }
      }
      local_14 = CfdFreePsbtPubkeyList(in_stack_fffffffffffff668,in_stack_fffffffffffff660);
      local_4bc = 0;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)CONCAT17(in_stack_fffffffffffff5cf,in_stack_fffffffffffff5c8),
                 in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8,
                 (int *)in_stack_fffffffffffff5b0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4b8);
      if (!bVar1) {
        testing::Message::Message(&local_4c8);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x39c2ae);
        testing::internal::AssertHelper::AssertHelper
                  (&local_4d0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x502,pcVar3);
        testing::internal::AssertHelper::operator=(&local_4d0,&local_4c8);
        testing::internal::AssertHelper::~AssertHelper(&local_4d0);
        testing::Message::~Message((Message *)0x39c311);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x39c366);
    }
    local_4d8 = (char *)0x0;
    local_14 = CfdGetPsbtRecord((void *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868
                                                ),in_stack_fffffffffffff860,
                                (int)((ulong)in_stack_fffffffffffff858 >> 0x20),
                                (uint32_t)in_stack_fffffffffffff858,
                                (char *)CONCAT17(uVar2,in_stack_fffffffffffff850),(char **)pAVar5);
    local_4ec = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT17(in_stack_fffffffffffff5cf,in_stack_fffffffffffff5c8),
               in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8,(int *)in_stack_fffffffffffff5b0)
    ;
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4e8);
    if (!bVar1) {
      testing::Message::Message(&local_4f8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x39c453);
      testing::internal::AssertHelper::AssertHelper
                (&local_500,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x507,pcVar3);
      testing::internal::AssertHelper::operator=(&local_500,&local_4f8);
      testing::internal::AssertHelper::~AssertHelper(&local_500);
      testing::Message::~Message((Message *)0x39c4b6);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x39c50b);
    if (local_14 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&stack0xfffffffffffffaf0,
                 "\"522102906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b2102622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f462224252ae\""
                 ,"value",
                 "522102906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b2102622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f462224252ae"
                 ,local_4d8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xfffffffffffffaf0);
      if (!bVar1) {
        testing::Message::Message((Message *)&stack0xfffffffffffffae8);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x39c5ba);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xfffffffffffffae0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x509,pcVar3);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xfffffffffffffae0,(Message *)&stack0xfffffffffffffae8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffae0);
        testing::Message::~Message((Message *)0x39c61d);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x39c675);
      local_14 = CfdFreeStringBuffer((char *)in_stack_fffffffffffff5b8);
      local_534 = 0;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)CONCAT17(in_stack_fffffffffffff5cf,in_stack_fffffffffffff5c8),
                 in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8,
                 (int *)in_stack_fffffffffffff5b0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xfffffffffffffad0);
      if (!bVar1) {
        testing::Message::Message(&local_540);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x39c736);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xfffffffffffffab8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x50c,pcVar3);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xfffffffffffffab8,&local_540);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffab8);
        testing::Message::~Message((Message *)0x39c799);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x39c7ee);
      local_4d8 = (char *)0x0;
    }
    pcVar3 = "0011223355";
    local_14 = CfdIsFindPsbtRecord(in_stack_fffffffffffff788,in_stack_fffffffffffff780,
                                   in_stack_fffffffffffff77c,in_stack_fffffffffffff778,
                                   &in_stack_fffffffffffff770->success_);
    local_56c = 8;
    this_00 = (AssertionResult *)&stack0xfffffffffffffa98;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT17(in_stack_fffffffffffff5cf,in_stack_fffffffffffff5c8),
               in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8,(int *)in_stack_fffffffffffff5b0)
    ;
    bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
    if (!bVar1) {
      testing::Message::Message(&local_578);
      in_stack_fffffffffffff660 =
           testing::AssertionResult::failure_message((AssertionResult *)0x39c8f2);
      testing::internal::AssertHelper::AssertHelper
                (&local_580,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x513,in_stack_fffffffffffff660);
      testing::internal::AssertHelper::operator=(&local_580,&local_578);
      testing::internal::AssertHelper::~AssertHelper(&local_580);
      testing::Message::~Message((Message *)0x39c955);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x39c9ad);
    local_14 = CfdAddPsbtRecord(in_stack_fffffffffffff828,
                                (void *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820
                                                ),(int)((ulong)in_stack_fffffffffffff818 >> 0x20),
                                (uint32_t)in_stack_fffffffffffff818,in_stack_fffffffffffff810,
                                (char *)CONCAT17(in_stack_fffffffffffff80f,in_stack_fffffffffffff808
                                                ));
    local_594 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT17(in_stack_fffffffffffff5cf,in_stack_fffffffffffff5c8),
               in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8,(int *)in_stack_fffffffffffff5b0)
    ;
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_590);
    if (!bVar1) {
      testing::Message::Message(&local_5a0);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x39ca8d);
      testing::internal::AssertHelper::AssertHelper
                (&local_5a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x516,pcVar4);
      testing::internal::AssertHelper::operator=(&local_5a8,&local_5a0);
      testing::internal::AssertHelper::~AssertHelper(&local_5a8);
      testing::Message::~Message((Message *)0x39caf0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x39cb48);
    local_14 = CfdIsFindPsbtRecord(in_stack_fffffffffffff788,in_stack_fffffffffffff780,
                                   in_stack_fffffffffffff77c,in_stack_fffffffffffff778,
                                   &in_stack_fffffffffffff770->success_);
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT17(in_stack_fffffffffffff5cf,in_stack_fffffffffffff5c8),
               in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8,(int *)in_stack_fffffffffffff5b0)
    ;
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_5b8);
    if (!bVar1) {
      testing::Message::Message((Message *)&stack0xfffffffffffffa38);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x39cc20);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffa30,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x519,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffa30,(Message *)&stack0xfffffffffffffa38);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffa30);
      testing::Message::~Message((Message *)0x39cc83);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x39ccdb);
    local_4d8 = (char *)0x0;
    local_14 = CfdGetPsbtRecord((void *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868
                                                ),in_stack_fffffffffffff860,
                                (int)((ulong)in_stack_fffffffffffff858 >> 0x20),
                                (uint32_t)in_stack_fffffffffffff858,
                                (char *)CONCAT17(uVar2,in_stack_fffffffffffff850),(char **)pAVar5);
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT17(in_stack_fffffffffffff5cf,in_stack_fffffffffffff5c8),
               in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8,(int *)in_stack_fffffffffffff5b0)
    ;
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffa20);
    if (!bVar1) {
      testing::Message::Message((Message *)&stack0xfffffffffffffa10);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x39cdc1);
      testing::internal::AssertHelper::AssertHelper
                (&local_5f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x51d,pcVar4);
      testing::internal::AssertHelper::operator=(&local_5f8,(Message *)&stack0xfffffffffffffa10);
      testing::internal::AssertHelper::~AssertHelper(&local_5f8);
      testing::Message::~Message((Message *)0x39ce1e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x39ce73);
    if (local_14 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_608,"exp_unknown_value","value",pcVar3,local_4d8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_608);
      if (!bVar1) {
        testing::Message::Message(&local_610);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x39cf17);
        testing::internal::AssertHelper::AssertHelper
                  (&local_618,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x51f,pcVar3);
        testing::internal::AssertHelper::operator=(&local_618,&local_610);
        testing::internal::AssertHelper::~AssertHelper(&local_618);
        testing::Message::~Message((Message *)0x39cf74);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x39cfc9);
      local_14 = CfdFreeStringBuffer((char *)in_stack_fffffffffffff5b8);
      pAVar5 = (AssertionResult *)&stack0xfffffffffffff9d8;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)CONCAT17(in_stack_fffffffffffff5cf,in_stack_fffffffffffff5c8),
                 in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8,
                 (int *)in_stack_fffffffffffff5b0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar5);
      if (!bVar1) {
        testing::Message::Message((Message *)&stack0xfffffffffffff9c8);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x39d07e);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xfffffffffffff9c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x522,pcVar3);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xfffffffffffff9c0,(Message *)&stack0xfffffffffffff9c8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffff9c0);
        testing::Message::~Message((Message *)0x39d0db);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x39d130);
      local_4d8 = (char *)0x0;
    }
    local_14 = CfdFreePsbtHandle(this_00,in_stack_fffffffffffff660);
    local_654 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT17(in_stack_fffffffffffff5cf,in_stack_fffffffffffff5c8),
               in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8,(int *)in_stack_fffffffffffff5b0)
    ;
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffff9b0);
    if (!bVar1) {
      testing::Message::Message(&local_660);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x39d1fb);
      testing::internal::AssertHelper::AssertHelper
                (&local_668,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x527,pcVar3);
      testing::internal::AssertHelper::operator=(&local_668,&local_660);
      testing::internal::AssertHelper::~AssertHelper(&local_668);
      testing::Message::~Message((Message *)0x39d258);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x39d2ad);
  }
  local_14 = CfdFreeHandle(in_stack_fffffffffffff5b8);
  local_67c = 0;
  pAVar5 = &local_678;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT17(in_stack_fffffffffffff5cf,in_stack_fffffffffffff5c8),&pAVar5->success_
             ,in_stack_fffffffffffff5b8,(int *)in_stack_fffffffffffff5b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar5);
  if (!bVar1) {
    testing::Message::Message(&local_688);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x39d364);
    testing::internal::AssertHelper::AssertHelper
              (&local_690,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
               ,0x52b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_690,&local_688);
    testing::internal::AssertHelper::~AssertHelper(&local_690);
    testing::Message::~Message((Message *)0x39d3c1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x39d416);
  return;
}

Assistant:

TEST(cfdcapi_psbt, GetPsbtOutput) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  int net_type = kCfdNetworkTestnet;
  void* psbt_handle = nullptr;
  const char* psbt_base64 = "cHNidP8BAF4CAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////ARBLzR0AAAAAIgAgPK0GGd5n5iR6dqECgTY1wFNFfGuk/eSsH/2BSNcOS8wAAAAAAAEBIAhYzR0AAAAAF6kUlF+1A5GnBjfB/8Wrf7ZTCMLyMXWHIgIDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/NHMEQCICBjWTfgUXDYPcMhOts6bq5mcTAI5KvDi0kSxWgN7E8MAiAzwIpxowdXsIRj1TDsBY7XQBlo+zC+9j1FSXIaDkhbhAEiAgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7R0cwRAIgXSdKeIfePvrehKSjScTDb1ibVWI7ECe32m2sicF4VjQCIGoDr+u7tgifHjf6yPmZpAFRYciSAUT9UxEtoFgEzUPMAQEDBAEAAAABBCIAIJxNrLJeu4rai7sa3bhp3qTYFwzJUfHZaUshVOFYMnbJAQVHUiEDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/MhA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHUq4iBgOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8xgqcEdgLAAAgAAAAIAAAACAAAAAAAsAAAAiBgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7Rxida22GLAAAgAAAAIAAAACAAAAAAAsAAAAAAQAiACA8rQYZ3mfmJHp2oQKBNjXAU0V8a6T95Kwf/YFI1w5LzAEBR1IhApBtOZ9tu+zImNS43j9JdHTIakHyzzbXH5XlygawdIZ7IQJiLHl07DLeda+jczsJpsM9DepRSyn6rM+wmRd09GIiQlKuIgICYix5dOwy3nWvo3M7CabDPQ3qUUsp+qzPsJkXdPRiIkIYnWtthiwAAIAAAACAAAAAgAAAAAAMAAAAIgICkG05n2277MiY1LjeP0l0dMhqQfLPNtcfleXKBrB0hnsYKnBHYCwAAIAAAACAAAAAgAAAAAAMAAAAAA==";
  ret = CfdCreatePsbtHandle(
    handle, net_type, psbt_base64, "", 0, 0, &psbt_handle);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    const char* pubkey = "02622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f4622242";
    ret = CfdIsFindPsbtPubkeyRecord(handle, psbt_handle, kCfdPsbtRecordOutputBip32, 0, pubkey);
    EXPECT_EQ(kCfdSuccess, ret);

    char* signature = nullptr;
    ret = CfdGetPsbtPubkeyRecord(handle, psbt_handle,
        kCfdPsbtRecordOutputBip32, 0, pubkey, &signature);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("9d6b6d862c0000800000008000000080000000000c000000", signature);
      ret = CfdFreeStringBuffer(signature);
      EXPECT_EQ(kCfdSuccess, ret);
    }

    char* fingerprint = nullptr;
    char* path = nullptr;
    ret = CfdGetPsbtBip32Data(handle, psbt_handle, kCfdPsbtRecordOutputBip32, 0, pubkey, &fingerprint, &path);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("9d6b6d86", fingerprint);
      EXPECT_STREQ("44'/0'/0'/0/12", path);
      ret = CfdFreeStringBuffer(fingerprint);
      EXPECT_EQ(kCfdSuccess, ret);
      ret = CfdFreeStringBuffer(path);
      EXPECT_EQ(kCfdSuccess, ret);
    }
    void* pubkey_list_handle = nullptr;
    uint32_t list_num = 0;
    ret = CfdGetPsbtPubkeyList(handle, psbt_handle, kCfdPsbtRecordOutputBip32,
        0, &list_num, &pubkey_list_handle);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(2, list_num);
    if (ret == kCfdSuccess) {
      char* pk = nullptr;
      fingerprint = nullptr;
      path = nullptr;
      for (uint32_t index=0; index<list_num; ++index) {
        ret = CfdGetPsbtPubkeyListData(handle, pubkey_list_handle, index, &pk, nullptr);
        EXPECT_EQ(kCfdSuccess, ret);
        if (ret == kCfdSuccess) {
          if (index == 0) {
            EXPECT_STREQ("02622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f4622242", pk);
          } else if (index == 1) {
            EXPECT_STREQ("02906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b", pk);
          }
          ret = CfdFreeStringBuffer(pk);
          EXPECT_EQ(kCfdSuccess, ret);
          pk = nullptr;
        }
        ret = CfdGetPsbtPubkeyListBip32Data(handle, pubkey_list_handle, index, &pk, &fingerprint, &path);
        EXPECT_EQ(kCfdSuccess, ret);
        CfdcapiPsbtDumpLog(ret, handle);
        if (ret == kCfdSuccess) {
          if (index == 0) {
            EXPECT_STREQ("02622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f4622242", pk);
            EXPECT_STREQ("9d6b6d86", fingerprint);
            EXPECT_STREQ("44'/0'/0'/0/12", path);
          } else if (index == 1) {
            EXPECT_STREQ("02906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b", pk);
            EXPECT_STREQ("2a704760", fingerprint);
            EXPECT_STREQ("44'/0'/0'/0/12", path);
          }
          ret = CfdFreeStringBuffer(pk);
          EXPECT_EQ(kCfdSuccess, ret);
          pk = nullptr;
          ret = CfdFreeStringBuffer(fingerprint);
          EXPECT_EQ(kCfdSuccess, ret);
          fingerprint = nullptr;
          ret = CfdFreeStringBuffer(path);
          EXPECT_EQ(kCfdSuccess, ret);
          path = nullptr;
        }
      }
      ret = CfdFreePsbtPubkeyList(handle, pubkey_list_handle);
      EXPECT_EQ(kCfdSuccess, ret);
    }

    char* value = nullptr;
    ret = CfdGetPsbtRecord(handle, psbt_handle, kCfdPsbtRecordTypeOutput, 0, "01", &value);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("522102906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b2102622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f462224252ae", value);

      ret = CfdFreeStringBuffer(value);
      EXPECT_EQ(kCfdSuccess, ret);
      value = nullptr;
    }

    const char* unknown_key = "98";
    const char* exp_unknown_value = "0011223355";
    ret = CfdIsFindPsbtRecord(handle, psbt_handle, kCfdPsbtRecordTypeOutput, 0, unknown_key);
    EXPECT_EQ(kCfdNotFoundError, ret);

    ret = CfdAddPsbtRecord(handle, psbt_handle, kCfdPsbtRecordTypeOutput, 0, unknown_key, exp_unknown_value);
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdIsFindPsbtRecord(handle, psbt_handle, kCfdPsbtRecordTypeOutput, 0, unknown_key);
    EXPECT_EQ(kCfdSuccess, ret);

    value = nullptr;
    ret = CfdGetPsbtRecord(handle, psbt_handle, kCfdPsbtRecordTypeOutput, 0, unknown_key, &value);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(exp_unknown_value, value);

      ret = CfdFreeStringBuffer(value);
      EXPECT_EQ(kCfdSuccess, ret);
      value = nullptr;
    }

    ret = CfdFreePsbtHandle(handle, psbt_handle);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}